

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
max_by_function::evaluate
          (max_by_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  expression_type *peVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar8;
  undefined4 extraout_var;
  ulong i;
  size_t sVar9;
  undefined4 extraout_var_00;
  reference pbVar10;
  assertion_error *this_01;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> key1;
  error_code ec2;
  ulong local_80;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_70;
  reference local_60;
  expression_type *local_58;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_50);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == value) && (ppVar1[1].type_ == expression)) {
    this_00 = (ppVar1->field_1).value_;
    bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (bVar4) {
      bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(this_00);
      if (!bVar4) {
        peVar2 = (args->
                 super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1].field_1.expression_;
        local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
        local_50._M_string_length = std::_V2::system_category();
        pbVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,0);
        local_58 = peVar2;
        iVar7 = (*peVar2->_vptr_expr_base[2])(peVar2,pbVar8,context,&local_50);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  (&local_70,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar7));
        bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (&local_70);
        bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                          (&local_70);
        if (bVar4 || bVar5) {
          local_80 = 0;
          uVar3 = 1;
          do {
            i = uVar3;
            sVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
            if (sVar9 <= i) break;
            pbVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,i)
            ;
            iVar7 = (*local_58->_vptr_expr_base[2])(local_58,pbVar8,context,&local_50);
            pbVar8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar7);
            bVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                              (pbVar8);
            if ((bVar4 == bVar6) &&
               (bVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                                  (pbVar8), bVar5 == bVar6)) {
              iVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                                (pbVar8,&local_70);
              bVar6 = true;
              if ((0 < iVar7) && (local_80 = i, &local_70 != pbVar8)) {
                basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::copy_assignment
                          (&local_70,pbVar8);
              }
            }
            else {
              std::error_code::operator=(ec,invalid_type);
              local_60 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         ::null_value(context);
              bVar6 = false;
            }
            uVar3 = i + 1;
          } while (bVar6);
          pbVar10 = local_60;
          if (sVar9 <= i) {
            pbVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                (this_00,local_80);
          }
        }
        else {
          std::error_code::operator=(ec,invalid_type);
          pbVar10 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value(context);
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_70);
        return pbVar10;
      }
      goto LAB_00380b16;
    }
  }
  std::error_code::operator=(ec,invalid_type);
LAB_00380b16:
  pbVar10 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ::null_value(context);
  return pbVar10;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_value() && args[1].is_expression()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                const auto& expr = args[1].expression();

                std::error_code ec2;
                Json key1 = expr.evaluate(arg0.at(0), context, ec2); 

                bool is_number = key1.is_number();
                bool is_string = key1.is_string();
                if (!(is_number || is_string))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    reference key2 = expr.evaluate(arg0.at(i), context, ec2); 
                    if (!(key2.is_number() == is_number && key2.is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (key2 > key1)
                    {
                        key1 = key2;
                        index = i;
                    }
                }

                return arg0.at(index);
            }